

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O3

void amrex::Warning_host(char *msg)

{
  Print *pPVar1;
  long in_RDI;
  char local_199;
  char *local_198;
  Print local_190;
  
  if (in_RDI != 0) {
    local_190.rank = -1;
    local_190.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    local_190.os = (ostream *)system::oserr;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.ss);
    *(undefined8 *)(&local_190.field_0x18 + *(long *)(local_190._16_8_ + -0x18)) =
         *(undefined8 *)(local_190.os + *(long *)(*(long *)local_190.os + -0x18) + 8);
    pPVar1 = Print::operator<<(&local_190,&local_198);
    local_199 = '!';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar1->ss,&local_199,1);
    local_199 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar1->ss,&local_199,1);
    Print::~Print(&local_190);
  }
  return;
}

Assistant:

void
amrex::Warning_host (const char * msg)
{
    if (msg) {
        amrex::Print(Print::AllProcs,amrex::ErrorStream()) << msg << '!' << '\n';
    }
}